

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O1

Error __thiscall
asmjit::CodeCompiler::_newReg
          (CodeCompiler *this,Reg *out,uint32_t typeId,char *nameFmt,__va_list_tag *ap)

{
  Error EVar1;
  StringBuilderTmp<256UL> sb;
  StringBuilder local_148;
  char local_128 [264];
  
  local_148._data = local_128;
  local_128[0] = '\0';
  local_148._length = 0;
  local_148._capacity = 0x100;
  local_148._canFree = 0;
  StringBuilder::_opVFormat(&local_148,1,nameFmt,ap);
  EVar1 = _newReg(this,out,typeId,local_148._data);
  StringBuilder::~StringBuilder(&local_148);
  return EVar1;
}

Assistant:

Error CodeCompiler::_newReg(Reg& out, uint32_t typeId, const char* nameFmt, va_list ap) {
  StringBuilderTmp<256> sb;
  sb.appendFormatVA(nameFmt, ap);
  return _newReg(out, typeId, sb.getData());
}